

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O2

void __thiscall
DenseHashSetMoveTest_MoveAssignment_Test::~DenseHashSetMoveTest_MoveAssignment_Test
          (DenseHashSetMoveTest_MoveAssignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DenseHashSetMoveTest, MoveAssignment)
{
    dense_hash_set<A, HashA> h, h2;
    h.set_empty_key(A(0));

    const int Elements = 100;
    for (int i = 1; i <= Elements; ++i)
        h.emplace(i);

    A::reset();
    h2 = std::move(h);

    ASSERT_EQ(Elements, (int)h2.size());

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(2, A::move_ctor); // swap() of empty & deleted key
    ASSERT_EQ(4, A::move_assign);
}